

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression *
slang::ast::Expression::bindLValue
          (ExpressionSyntax *syntax,ASTContext *context,bitmask<slang::ast::AssignFlags> assignFlags
          )

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Expression *pEVar3;
  
  iVar2 = bind((int)syntax,(sockaddr *)context,0x100000);
  pEVar3 = (Expression *)CONCAT44(extraout_var,iVar2);
  bVar1 = requireLValue(pEVar3,context,(SourceLocation)0x0,assignFlags,(Expression *)0x0);
  if (bVar1) {
    return pEVar3;
  }
  pEVar3 = badExpr(((context->scope).ptr)->compilation,pEVar3);
  return pEVar3;
}

Assistant:

const Expression& Expression::bindLValue(const ExpressionSyntax& syntax, const ASTContext& context,
                                         bitmask<AssignFlags> assignFlags) {
    auto& expr = bind(syntax, context, ASTFlags::LValue);
    if (!expr.requireLValue(context, {}, assignFlags))
        return badExpr(context.getCompilation(), &expr);
    return expr;
}